

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorProto_ExtensionRange::MergePartialFromCodedStream
          (DescriptorProto_ExtensionRange *this,CodedInputStream *input)

{
  uint8 uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  uint8 *puVar4;
  uint8 *puVar5;
  int iVar6;
  uint32 uVar7;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_001e5b57:
  do {
    while( true ) {
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar7 = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
        input->last_tag_ = uVar7;
        input->buffer_ = puVar5 + 1;
      }
      else {
        uVar7 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar7;
      }
      if (uVar7 == 0) {
        return true;
      }
      uVar3 = uVar7 & 7;
      if (uVar7 >> 3 != 2) break;
      if (uVar3 != 0) goto LAB_001e5bc5;
      puVar4 = input->buffer_;
      puVar5 = input->buffer_end_;
LAB_001e5c31:
      if ((puVar4 < puVar5) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
        puVar4 = puVar4 + 1;
        input->buffer_ = puVar4;
        uVar7 = (int)(char)uVar1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_38);
        if (!bVar2) {
          return false;
        }
        puVar4 = input->buffer_;
        puVar5 = input->buffer_end_;
        uVar7 = (uint32)local_38;
      }
      this->end_ = uVar7;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      if ((puVar4 == puVar5) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
    if ((uVar7 >> 3 == 1) && (uVar3 == 0)) {
      puVar4 = input->buffer_;
      puVar5 = input->buffer_end_;
      if ((puVar4 < puVar5) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
        puVar4 = puVar4 + 1;
        input->buffer_ = puVar4;
        iVar6 = (int)(char)uVar1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)((long)&local_38 + 4));
        if (!bVar2) {
          return false;
        }
        puVar4 = input->buffer_;
        puVar5 = input->buffer_end_;
        iVar6 = local_38._4_4_;
      }
      this->start_ = iVar6;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      if ((puVar4 < puVar5) && (*puVar4 == '\x10')) {
        puVar4 = puVar4 + 1;
        input->buffer_ = puVar4;
        goto LAB_001e5c31;
      }
      goto LAB_001e5b57;
    }
LAB_001e5bc5:
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,uVar7,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorProto_ExtensionRange::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 start = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &start_)));
          set_has_start();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_end;
        break;
      }

      // optional int32 end = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_end:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &end_)));
          set_has_end();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}